

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

int lua_isnumber(lua_State *L,int idx)

{
  uint uVar1;
  StrScanFmt SVar2;
  TValue *pTVar3;
  TValue tmp;
  TValue TStack_8;
  
  pTVar3 = index2adr(L,idx);
  uVar1 = 1;
  if ((0xfffeffff < (pTVar3->field_2).it) && (uVar1 = 0, (pTVar3->field_2).it == 0xfffffffb)) {
    SVar2 = lj_strscan_scan((uint8_t *)((ulong)(pTVar3->u32).lo + 0x10),&TStack_8,2);
    uVar1 = (uint)(SVar2 != STRSCAN_ERROR);
  }
  return uVar1;
}

Assistant:

LUA_API int lua_isnumber(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  return (tvisnumber(o) || (tvisstr(o) && lj_strscan_number(strV(o), &tmp)));
}